

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void ppc_cpu_unrealize_ppc64(CPUState *dev)

{
  int iVar1;
  opc_handler_t_conflict **ppoVar2;
  opc_handler_t_conflict **ppoVar3;
  int local_34;
  int local_30;
  int k;
  int j;
  int i;
  opc_handler_t_conflict **table_2;
  opc_handler_t_conflict **table;
  PowerPCCPU_conflict4 *cpu;
  CPUState *dev_local;
  
  for (k = 0; k < 0x40; k = k + 1) {
    if ((dev[3].tb_jmp_cache[(long)k + 0xa03] != (TranslationBlock *)&invalid_handler) &&
       (iVar1 = is_indirect_opcode(dev[3].tb_jmp_cache[(long)k + 0xa03]), iVar1 != 0)) {
      ppoVar2 = ind_table(dev[3].tb_jmp_cache[(long)k + 0xa03]);
      for (local_30 = 0; local_30 < 0x20; local_30 = local_30 + 1) {
        if ((ppoVar2[local_30] != &invalid_handler) &&
           (iVar1 = is_indirect_opcode(ppoVar2[local_30]), iVar1 != 0)) {
          ppoVar3 = ind_table(ppoVar2[local_30]);
          for (local_34 = 0; local_34 < 0x20; local_34 = local_34 + 1) {
            if ((ppoVar3[local_34] != &invalid_handler) &&
               (iVar1 = is_indirect_opcode(ppoVar3[local_34]), iVar1 != 0)) {
              g_free((gpointer)((ulong)ppoVar3[local_34] & 0xfffffffffffffffe));
            }
          }
          g_free((gpointer)((ulong)ppoVar2[local_30] & 0xfffffffffffffffe));
        }
      }
      g_free((gpointer)((ulong)dev[3].tb_jmp_cache[(long)k + 0xa03] & 0xfffffffffffffffe));
    }
  }
  return;
}

Assistant:

void ppc_cpu_unrealize(CPUState *dev)
{
    PowerPCCPU *cpu = POWERPC_CPU(dev);
    opc_handler_t **table, **table_2;
    int i, j, k;

    for (i = 0; i < PPC_CPU_OPCODES_LEN; i++) {
        if (cpu->opcodes[i] == &invalid_handler) {
            continue;
        }
        if (is_indirect_opcode(cpu->opcodes[i])) {
            table = ind_table(cpu->opcodes[i]);
            for (j = 0; j < PPC_CPU_INDIRECT_OPCODES_LEN; j++) {
                if (table[j] == &invalid_handler) {
                    continue;
                }
                if (is_indirect_opcode(table[j])) {
                    table_2 = ind_table(table[j]);
                    for (k = 0; k < PPC_CPU_INDIRECT_OPCODES_LEN; k++) {
                        if (table_2[k] != &invalid_handler &&
                            is_indirect_opcode(table_2[k])) {
                            g_free((opc_handler_t *)((uintptr_t)table_2[k] &
                                                     ~PPC_INDIRECT));
                        }
                    }
                    g_free((opc_handler_t *)((uintptr_t)table[j] &
                                             ~PPC_INDIRECT));
                }
            }
            g_free((opc_handler_t *)((uintptr_t)cpu->opcodes[i] &
                ~PPC_INDIRECT));
        }
    }
}